

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.h
# Opt level: O2

void __thiscall Layer::Layer(Layer *this,int nodes,int nextNodes)

{
  ConstantReturnType CStack_48;
  
  this->size = nodes;
  this->nextSize = nextNodes;
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
            (&CStack_48,(long)nextNodes,(long)nodes);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->weights,&CStack_48);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
            (&CStack_48,(long)this->nextSize,(long)this->size);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->weightGrads,&CStack_48);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&CStack_48,(long)this->size);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((Matrix<float,_1,1,0,_1,1> *)&this->bias,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&CStack_48);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&CStack_48,(long)this->size);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((Matrix<float,_1,1,0,_1,1> *)&this->biasGrads,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&CStack_48);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&CStack_48,(long)this->size);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((Matrix<float,_1,1,0,_1,1> *)&this->output,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&CStack_48);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&CStack_48,(long)this->size);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((Matrix<float,_1,1,0,_1,1> *)&this->loss,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&CStack_48);
  return;
}

Assistant:

Layer(int nodes, int nextNodes)
        : size(nodes), nextSize(nextNodes), weights(Eigen::MatrixXf::Zero(nextSize, nodes)),
          weightGrads(Eigen::MatrixXf::Zero(nextSize, size)), bias(Eigen::VectorXf::Zero(size)),
          biasGrads(Eigen::VectorXf::Zero(size)), output(Eigen::VectorXf::Zero(size)),
          loss(Eigen::VectorXf::Zero(size)){}